

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O0

Error __thiscall asmjit::v1_14::CodeHolder::resolveUnresolvedLinks(CodeHolder *this)

{
  uint uVar1;
  uint32_t uVar2;
  Section *pSVar3;
  ulong uVar4;
  Section *pSVar5;
  bool bVar6;
  unsigned_long uVar7;
  LabelLink *pLVar8;
  Section **ppSVar9;
  CodeBuffer *pCVar10;
  unsigned_long uVar11;
  OffsetFormat *in_RDI;
  int64_t displacement;
  uint64_t fromOffset;
  FastUInt8 localOF;
  CodeBuffer *buf;
  size_t linkOffset;
  Section *fromSection;
  uint32_t linkSectionId;
  uint64_t toOffset;
  Section *toSection;
  FastUInt8 of;
  LabelLinkIterator link;
  LabelEntry *le;
  const_iterator __end2;
  const_iterator __begin2;
  ZoneVector<asmjit::v1_14::LabelEntry_*> *__range2;
  Error err;
  char *in_stack_00000290;
  int in_stack_0000029c;
  char *in_stack_000002a0;
  CodeHolder *in_stack_fffffffffffffe98;
  LabelLinkIterator *in_stack_fffffffffffffea0;
  ZoneVector<asmjit::v1_14::Section_*> *in_stack_fffffffffffffea8;
  unsigned_long *in_stack_fffffffffffffeb0;
  LabelLinkIterator *offset64;
  void *dst;
  LabelLinkIterator local_d8;
  long local_c8;
  OffsetFormat local_c0;
  OffsetFormat local_b8;
  OffsetFormat *local_b0;
  Error local_a4;
  Error local_94;
  CodeBuffer *local_90;
  CodeBuffer *local_88;
  CodeBuffer *local_80;
  OffsetFormat *local_68;
  OffsetFormat *local_60;
  long local_58;
  long local_50;
  Section *local_48;
  undefined8 local_40;
  long local_38;
  uint32_t local_2c;
  Section *local_20;
  OffsetFormat *local_18;
  OffsetFormat *local_10;
  OffsetFormat *local_8;
  
  if (in_RDI[0x28] == (OffsetFormat)0x0) {
    local_94 = 0;
  }
  else {
    local_a4 = 0;
    local_b0 = in_RDI + 0x1f;
    uVar1._0_1_ = in_RDI[0x20]._type;
    uVar1._1_1_ = in_RDI[0x20]._flags;
    uVar1._2_1_ = in_RDI[0x20]._regionSize;
    uVar1._3_1_ = in_RDI[0x20]._valueSize;
    local_c0 = (OffsetFormat)((long)*local_b0 + (ulong)uVar1 * 8);
    local_68 = local_b0;
    local_60 = local_b0;
    local_10 = local_b0;
    local_8 = local_b0;
    for (local_b8 = *local_b0; local_b8 != local_c0; local_b8 = (OffsetFormat)((long)local_b8 + 8))
    {
      local_c8 = *(long *)local_b8;
      if (*(long *)(local_c8 + 0x20) != 0) {
        local_58 = local_c8;
        LabelLinkIterator::LabelLinkIterator
                  (in_stack_fffffffffffffea0,(LabelEntry *)in_stack_fffffffffffffe98);
        bVar6 = LabelLinkIterator::operator_cast_to_bool((LabelLinkIterator *)0x11c263);
        if (bVar6) {
          local_50 = local_c8;
          local_40 = *(undefined8 *)(local_c8 + 0x20);
          local_38 = local_c8;
          uVar7 = Support::addOverflow<unsigned_long>
                            (in_stack_fffffffffffffeb0,(unsigned_long *)in_stack_fffffffffffffea8,
                             (FastUInt8 *)in_stack_fffffffffffffea0);
          do {
            pLVar8 = LabelLinkIterator::operator->(&local_d8);
            uVar2 = pLVar8->sectionId;
            pLVar8 = LabelLinkIterator::operator->(&local_d8);
            if (pLVar8->relocId == 0xffffffff) {
              local_2c = uVar2;
              ppSVar9 = ZoneVector<asmjit::v1_14::Section_*>::operator[]
                                  (in_stack_fffffffffffffea8,(size_t)in_stack_fffffffffffffea0);
              pSVar3 = *ppSVar9;
              pLVar8 = LabelLinkIterator::operator->(&local_d8);
              uVar4 = pLVar8->offset;
              ppSVar9 = ZoneVector<asmjit::v1_14::Section_*>::operator[]
                                  (in_stack_fffffffffffffea8,(size_t)in_stack_fffffffffffffea0);
              pSVar5 = *ppSVar9;
              pCVar10 = &pSVar5->_buffer;
              local_80 = pCVar10;
              local_20 = pSVar5;
              if ((pSVar5->_buffer)._size <= uVar4) {
                DebugUtils::assertionFailed(in_stack_000002a0,in_stack_0000029c,in_stack_00000290);
              }
              dst = (void *)pSVar3->_offset;
              local_48 = pSVar3;
              uVar11 = Support::addOverflow<unsigned_long>
                                 (in_stack_fffffffffffffeb0,
                                  (unsigned_long *)in_stack_fffffffffffffea8,
                                  (FastUInt8 *)in_stack_fffffffffffffea0);
              in_stack_fffffffffffffeb0 = (unsigned_long *)(uVar7 - uVar11);
              pLVar8 = LabelLinkIterator::operator->(&local_d8);
              in_stack_fffffffffffffea0 =
                   (LabelLinkIterator *)((long)in_stack_fffffffffffffeb0 + pLVar8->rel);
              local_88 = pCVar10;
              if ((pSVar5->_buffer)._size <= uVar4) {
                DebugUtils::assertionFailed(in_stack_000002a0,in_stack_0000029c,in_stack_00000290);
              }
              in_stack_fffffffffffffea8 =
                   (ZoneVector<asmjit::v1_14::Section_*> *)((pSVar5->_buffer)._size - uVar4);
              local_90 = pCVar10;
              pLVar8 = LabelLinkIterator::operator->(&local_d8);
              local_18 = &pLVar8->format;
              if (in_stack_fffffffffffffea8 <
                  (ZoneVector<asmjit::v1_14::Section_*> *)(ulong)(pLVar8->format)._valueSize) {
                DebugUtils::assertionFailed(in_stack_000002a0,in_stack_0000029c,in_stack_00000290);
              }
              in_stack_fffffffffffffe98 = (CodeHolder *)(pCVar10->_data + uVar4);
              offset64 = in_stack_fffffffffffffea0;
              LabelLinkIterator::operator->(&local_d8);
              bVar6 = CodeWriterUtils::writeOffset(dst,(int64_t)offset64,in_RDI);
              if (!bVar6) {
                local_a4 = DebugUtils::errored(0x30);
                goto LAB_0011c595;
              }
              LabelLinkIterator::resolveAndNext(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98)
              ;
            }
            else {
LAB_0011c595:
              LabelLinkIterator::next(&local_d8);
            }
            bVar6 = LabelLinkIterator::operator_cast_to_bool((LabelLinkIterator *)0x11c5af);
          } while (bVar6);
        }
      }
    }
    local_94 = local_a4;
  }
  return local_94;
}

Assistant:

ASMJIT_API Error CodeHolder::resolveUnresolvedLinks() noexcept {
  if (!hasUnresolvedLinks())
    return kErrorOk;

  Error err = kErrorOk;
  for (LabelEntry* le : labelEntries()) {
    if (!le->isBound())
      continue;

    LabelLinkIterator link(le);
    if (link) {
      Support::FastUInt8 of = 0;
      Section* toSection = le->section();
      uint64_t toOffset = Support::addOverflow(toSection->offset(), le->offset(), &of);

      do {
        uint32_t linkSectionId = link->sectionId;
        if (link->relocId == Globals::kInvalidId) {
          Section* fromSection = sectionById(linkSectionId);
          size_t linkOffset = link->offset;

          CodeBuffer& buf = _sections[linkSectionId]->buffer();
          ASMJIT_ASSERT(linkOffset < buf.size());

          // Calculate the offset relative to the start of the virtual base.
          Support::FastUInt8 localOF = of;
          uint64_t fromOffset = Support::addOverflow<uint64_t>(fromSection->offset(), linkOffset, &localOF);
          int64_t displacement = int64_t(toOffset - fromOffset + uint64_t(int64_t(link->rel)));

          if (!localOF) {
            ASMJIT_ASSERT(size_t(linkOffset) < buf.size());
            ASMJIT_ASSERT(buf.size() - size_t(linkOffset) >= link->format.valueSize());

            // Overwrite a real displacement in the CodeBuffer.
            if (CodeWriterUtils::writeOffset(buf._data + linkOffset, displacement, link->format)) {
              link.resolveAndNext(this);
              continue;
            }
          }

          err = DebugUtils::errored(kErrorInvalidDisplacement);
          // Falls through to `link.next()`.
        }

        link.next();
      } while (link);
    }
  }

  return err;
}